

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

void Sle_ManPrintCuts(Gia_Man_t *p,Vec_Int_t *vCuts,int iObj)

{
  int iVar1;
  int *piVar2;
  int *pList;
  int *pCut;
  int i;
  int iObj_local;
  Vec_Int_t *vCuts_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(vCuts,iObj);
  piVar2 = Vec_IntEntryP(vCuts,iVar1);
  printf("Obj %3d\n",(ulong)(uint)iObj);
  pCut._0_4_ = 0;
  pList = piVar2 + 1;
  while ((int)pCut < *piVar2) {
    Sle_ManPrintCut(pList);
    pCut._0_4_ = (int)pCut + 1;
    iVar1 = Sle_CutSize(pList);
    pList = pList + (iVar1 + 1);
  }
  printf("\n");
  return;
}

Assistant:

void Sle_ManPrintCuts( Gia_Man_t * p, Vec_Int_t * vCuts, int iObj )
{
    int i, * pCut;
    int * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    printf( "Obj %3d\n", iObj );
    Sle_ForEachCut( pList, pCut, i )
        Sle_ManPrintCut( pCut );
    printf( "\n" );
}